

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

idx_t __thiscall duckdb_shell::ShellState::RenderLength(ShellState *this,char *z)

{
  size_t len;
  size_t sVar1;
  
  len = strlen(z);
  sVar1 = linenoiseComputeRenderWidth(z,len);
  return sVar1;
}

Assistant:

idx_t ShellState::RenderLength(const char *z) {
#ifdef HAVE_LINENOISE
	return linenoiseComputeRenderWidth(z, strlen(z));
#else
	int n = 0;
	while (*z) {
		if ((0xc0 & *(z++)) != 0x80)
			n++;
	}
	return n;
#endif
}